

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall chrono::ChArchiveOut::out_version(ChArchiveOut *this,int mver,type_info *mtype)

{
  string *psVar1;
  string class_name_polished;
  char local_7d;
  int local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined8 local_38;
  int *local_30;
  undefined1 local_28;
  
  if ((this->super_ChArchive).use_versions == true) {
    local_7c = mver;
    psVar1 = ChClassFactory::GetClassTagName_abi_cxx11_(mtype);
    std::__cxx11::string::string
              ((string *)&local_58,(psVar1->_M_dataplus)._M_p,(allocator *)&local_78);
    local_78._M_dataplus._M_p._0_1_ = 0x3c;
    local_7d = '[';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_58._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_58._M_dataplus._M_p + local_58._M_string_length),(char *)&local_78,&local_7d
              );
    local_78._M_dataplus._M_p._0_1_ = 0x3e;
    local_7d = ']';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_58._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_58._M_dataplus._M_p + local_58._M_string_length),(char *)&local_78,&local_7d
              );
    local_78._M_dataplus._M_p._0_1_ = 0x20;
    local_7d = '_';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_58._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_58._M_dataplus._M_p + local_58._M_string_length),(char *)&local_78,&local_7d
              );
    std::operator+(&local_78,"_version_",&local_58);
    local_38 = CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_);
    local_30 = &local_7c;
    local_28 = 0;
    (*(this->super_ChArchive)._vptr_ChArchive[3])(this);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

virtual void out_version(int mver, const std::type_info& mtype) {
          if (use_versions) {
              const char* class_name = "";
                  try {
                      class_name = ChClassFactory::GetClassTagName(mtype).c_str(); // registered
                  } catch(const ChException &) {   
                      class_name = mtype.name();
                  }
				  std::string class_name_polished = class_name;
				  // to avoid troubles in xml archives
				  std::replace(class_name_polished.begin(), class_name_polished.end(), '<', '[');
				  std::replace(class_name_polished.begin(), class_name_polished.end(), '>', ']');
				  std::replace(class_name_polished.begin(), class_name_polished.end(), ' ', '_');
              this->out(ChNameValue<int>(("_version_" + class_name_polished).c_str(), mver));
          }
      }